

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalMapping::clear_MappingType(CategoricalMapping *this)

{
  StringToInt64Map *this_00;
  Int64ToStringMap *this_01;
  MappingTypeCase MVar1;
  Arena *pAVar2;
  CategoricalMapping *this_local;
  
  MVar1 = MappingType_case(this);
  if (MVar1 != MAPPINGTYPE_NOT_SET) {
    if (MVar1 == kStringToInt64Map) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_00 = (this->MappingType_).stringtoint64map_, this_00 != (StringToInt64Map *)0x0)) {
        StringToInt64Map::~StringToInt64Map(this_00);
        operator_delete(this_00,0x48);
      }
    }
    else if (((MVar1 == kInt64ToStringMap) &&
             (pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation
                                 (&this->super_MessageLite), pAVar2 == (Arena *)0x0)) &&
            (this_01 = (this->MappingType_).int64tostringmap_, this_01 != (Int64ToStringMap *)0x0))
    {
      Int64ToStringMap::~Int64ToStringMap(this_01);
      operator_delete(this_01,0x48);
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void CategoricalMapping::clear_MappingType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CategoricalMapping)
  switch (MappingType_case()) {
    case kStringToInt64Map: {
      if (GetArenaForAllocation() == nullptr) {
        delete MappingType_.stringtoint64map_;
      }
      break;
    }
    case kInt64ToStringMap: {
      if (GetArenaForAllocation() == nullptr) {
        delete MappingType_.int64tostringmap_;
      }
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = MAPPINGTYPE_NOT_SET;
}